

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O1

bool wasm::FunctionUtils::equal(Function *left,Function *right)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  Type TVar4;
  Type TVar5;
  Index index;
  Signature SVar6;
  Type local_38;
  
  local_38.id = (left->type).id;
  if (local_38.id != (right->type).id) {
    return false;
  }
  sVar2 = Function::getNumVars(left);
  sVar3 = Function::getNumVars(right);
  if (sVar2 == sVar3) {
    SVar6 = HeapType::getSignature(&left->type);
    local_38 = SVar6.params.id;
    sVar2 = wasm::Type::size(&local_38);
    index = (Index)sVar2;
    sVar3 = Function::getNumLocals(left);
    bVar1 = (sVar2 & 0xffffffff) < sVar3;
    if ((sVar2 & 0xffffffff) < sVar3) {
      TVar4 = Function::getLocalType(left,index);
      TVar5 = Function::getLocalType(right,index);
      if (TVar4.id == TVar5.id) {
        do {
          index = index + 1;
          sVar2 = Function::getNumLocals(left);
          bVar1 = index < sVar2;
          if (sVar2 <= index) goto LAB_00863bb3;
          TVar4 = Function::getLocalType(left,index);
          TVar5 = Function::getLocalType(right,index);
        } while (TVar4.id == TVar5.id);
      }
      if (bVar1) {
        return false;
      }
    }
LAB_00863bb3:
    if ((left->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
      return (right->super_Importable).module.super_IString.str._M_str != (char *)0x0;
    }
    if ((right->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
      bVar1 = ExpressionAnalyzer::equal(left->body,right->body);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool operator!=(const HeapType& other) const { return id != other.id; }